

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<tm>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  iterator iVar4;
  type f;
  undefined **local_238;
  undefined1 *local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  uStack_228 = 0;
  local_238 = &PTR_grow_0016afe0;
  local_220 = 500;
  local_230 = local_218;
  pcVar3 = formatter<tm,char,void>::
           parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
                     ((formatter<tm,char,void> *)&local_238,
                      (basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx);
  pcVar2 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ).parse_context_.format_str_.data_;
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).parse_context_.format_str_.data_ = pcVar3;
  psVar1 = &(ctx->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            ).parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = formatter<tm,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<tm,char,void> *)&local_238,(tm *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).out_.container = iVar4.container;
  local_238 = &PTR_grow_0016afe0;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }